

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_83(QPDF *pdf,char *arg2)

{
  ostream *poVar1;
  element_type *peVar2;
  QPDFUsage *e;
  exception *e_1;
  string local_70 [48];
  ulong local_40;
  size_t size;
  shared_ptr<char> file_buf;
  QPDFJob j;
  char *arg2_local;
  QPDF *pdf_local;
  
  QPDFJob::QPDFJob((QPDFJob *)
                   &file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<char>::shared_ptr((shared_ptr<char> *)&size);
  QUtil::read_file_into_memory(arg2,(shared_ptr *)&size,&local_40);
  poVar1 = std::operator<<((ostream *)&std::cout,"calling initializeFromJson");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  peVar2 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&size);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,peVar2,local_40,(allocator *)((long)&e_1 + 7));
  QPDFJob::initializeFromJson
            ((string *)&file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             SUB81(local_70,0));
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_1 + 7));
  poVar1 = std::operator<<((ostream *)&std::cout,"called initializeFromJson");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<char>::~shared_ptr((shared_ptr<char> *)&size);
  QPDFJob::~QPDFJob((QPDFJob *)
                    &file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void
test_83(QPDF& pdf, char const* arg2)
{
    // Test QPDFJob json with partial = false. For testing with
    // partial = true, we just use qpdf --job-json-file.

    QPDFJob j;
    std::shared_ptr<char> file_buf;
    size_t size;
    QUtil::read_file_into_memory(arg2, file_buf, size);
    try {
        std::cout << "calling initializeFromJson" << std::endl;
        j.initializeFromJson(std::string(file_buf.get(), size));
        std::cout << "called initializeFromJson" << std::endl;
    } catch (QPDFUsage& e) {
        std::cerr << "usage: " << e.what() << std::endl;
    } catch (std::exception& e) {
        std::cerr << "exception: " << e.what() << std::endl;
    }
}